

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O1

void simd::Threshold(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                    uint32_t startYOut,uint32_t width,uint32_t height,uint8_t minThreshold,
                    uint8_t maxThreshold,SIMDType simdType)

{
  uint8_t *outYEnd;
  uint8_t *puVar1;
  uint rowSizeIn;
  uint rowSizeOut;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  Image *pIVar8;
  uint32_t simdWidth;
  uint8_t *outY;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  uint8_t *inY;
  undefined4 in_register_0000008c;
  byte *pbVar9;
  uint totalSimdWidth;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint8_t *puVar13;
  uint uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  uint32_t local_b0;
  uint32_t local_ac;
  Image *local_a8;
  uint32_t local_a0;
  uint32_t local_9c;
  ulong local_98;
  undefined8 local_90;
  undefined8 local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  local_88 = CONCAT44(in_register_0000008c,startYOut);
  local_90 = CONCAT44(in_register_00000014,startYIn);
  uVar11 = (ulong)simdType;
  do {
    local_ac = width;
    local_b0 = height;
    uVar15 = 0;
    uVar10 = (uint)uVar11;
    if (uVar10 < 4) {
      uVar15 = (ulong)*(uint *)(&DAT_001ddb20 + uVar11 * 4);
    }
    if (uVar10 == 3) break;
    uVar14 = (uint)uVar15;
    if (uVar14 <= width) {
      local_a0 = startXIn;
      local_9c = startXOut;
      Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
                (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
      local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      local_80._data = (uchar *)0x0;
      local_80._type = out->_type;
      local_a8 = out;
      PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src);
      Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
      Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_80);
      local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
      pIVar8 = local_a8;
      local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      local_58._data = (uchar *)0x0;
      local_58._type = local_a8->_type;
      PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)local_a8,src_00);
      Image_Function::
      OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                (&local_ac,&local_b0,in,&local_58);
      local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
      rowSizeIn = in->_rowSize;
      local_98 = (ulong)rowSizeIn;
      rowSizeOut = pIVar8->_rowSize;
      uVar11 = local_ac / uVar15;
      uVar15 = (ulong)local_ac % uVar15;
      inY = in->_data + (ulong)local_a0 + (ulong)((int)local_90 * rowSizeIn);
      outY = pIVar8->_data + (ulong)local_9c + (ulong)((int)local_88 * rowSizeOut);
      outYEnd = outY + local_b0 * rowSizeOut;
      simdWidth = (uint32_t)uVar11;
      totalSimdWidth = simdWidth * uVar14;
      if (uVar10 == 1) {
        if (local_b0 * rowSizeOut != 0) {
          auVar3 = vpbroadcastb_avx512vl();
          auVar4 = vpbroadcastb_avx512vl();
          auVar16[8] = 0x80;
          auVar16._0_8_ = 0x8080808080808080;
          auVar16[9] = 0x80;
          auVar16[10] = 0x80;
          auVar16[0xb] = 0x80;
          auVar16[0xc] = 0x80;
          auVar16[0xd] = 0x80;
          auVar16[0xe] = 0x80;
          auVar16[0xf] = 0x80;
          do {
            if (uVar14 <= local_ac) {
              lVar12 = 0;
              do {
                lVar7 = lVar12 + 0x10;
                auVar2 = auVar16 ^ *(undefined1 (*) [16])(inY + lVar7 + -0x10);
                uVar5 = vpcmpb_avx512vl(auVar3,auVar2,2);
                uVar6 = vpcmpb_avx512vl(auVar2,auVar4,2);
                auVar2 = vpmovm2b_avx512vl(uVar5 & uVar6);
                *(undefined1 (*) [16])(outY + lVar12) = auVar2;
                lVar12 = lVar12 + 0x10;
              } while (inY + lVar7 != inY + uVar11 * 0x10);
            }
            if (local_ac != totalSimdWidth) {
              puVar13 = outY + totalSimdWidth;
              puVar1 = puVar13 + uVar15;
              pbVar9 = inY + totalSimdWidth;
              do {
                *puVar13 = -(*pbVar9 <= maxThreshold && minThreshold <= *pbVar9);
                puVar13 = puVar13 + 1;
                pbVar9 = pbVar9 + 1;
              } while (puVar13 != puVar1);
            }
            outY = outY + rowSizeOut;
            inY = inY + local_98;
          } while (outY != outYEnd);
        }
      }
      else if (uVar10 == 0) {
        avx::Threshold(rowSizeIn,rowSizeOut,inY,outY,outYEnd,minThreshold,maxThreshold,simdWidth,
                       totalSimdWidth,(uint32_t)uVar15);
      }
      return;
    }
    uVar11 = 1;
  } while (uVar10 == 0);
  Image_Function::Threshold
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height,minThreshold,maxThreshold);
  return;
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height, uint8_t minThreshold, uint8_t maxThreshold, SIMDType simdType )
    {
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width < simdSize) ) {
            AVX_CODE( Threshold( in, startXIn, startYIn, out, startXOut, startYOut, width, height, minThreshold, maxThreshold, sse_function ); )

            Image_Function::Threshold( in, startXIn, startYIn, out, startXOut, startYOut, width, height, minThreshold, maxThreshold );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyGrayScaleImage( in, out );

        Image_Function::OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, minThreshold, maxThreshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, minThreshold, maxThreshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, minThreshold, maxThreshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }